

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::CompilationUnitSymbol::CompilationUnitSymbol
          (CompilationUnitSymbol *this,Compilation *compilation,SourceLibrary *sourceLibrary)

{
  optional<slang::TimeScale> oVar1;
  PackageSymbol *this_00;
  WildcardImportSymbol *item;
  undefined1 uVar2;
  _Storage<slang::TimeScale,_true> _Var3;
  undefined8 in_RDX;
  Compilation *in_RSI;
  Symbol *in_RDI;
  WildcardImportSymbol *import;
  PackageSymbol *stdPkg;
  Compilation *in_stack_ffffffffffffffb8;
  Scope *in_stack_ffffffffffffffc0;
  undefined3 in_stack_ffffffffffffffc8;
  SourceLocation in_stack_ffffffffffffffd0;
  string_view local_28;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffc0,
             (char *)in_stack_ffffffffffffffb8);
  SourceLocation::SourceLocation((SourceLocation *)&stack0xffffffffffffffd0);
  Symbol::Symbol(in_RDI,CompilationUnit,local_28,in_stack_ffffffffffffffd0);
  Scope::Scope(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_RDI);
  std::optional<slang::TimeScale>::optional((optional<slang::TimeScale> *)0xf9158a);
  *(undefined8 *)(in_RDI + 2) = in_RDX;
  *(undefined1 *)&in_RDI[2].name._M_len = 0;
  std::optional<slang::SourceRange>::optional((optional<slang::SourceRange> *)0xf915ae);
  std::optional<slang::SourceRange>::optional((optional<slang::SourceRange> *)0xf915bf);
  oVar1 = Compilation::getDefaultTimeScale(in_RSI);
  _Var3 = oVar1.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
          super__Optional_payload_base<slang::TimeScale>._M_payload;
  uVar2 = oVar1.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
          super__Optional_payload_base<slang::TimeScale>._M_engaged;
  *(_Storage<slang::TimeScale,_true> *)&in_RDI[1].originatingSyntax = _Var3;
  *(undefined1 *)((long)&in_RDI[1].originatingSyntax + 4) = uVar2;
  this_00 = Compilation::getStdPackage(in_RSI);
  item = BumpAllocator::
         emplace<slang::ast::WildcardImportSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&>
                   ((BumpAllocator *)in_stack_ffffffffffffffd0,
                    (basic_string_view<char,_std::char_traits<char>_> *)
                    CONCAT17(uVar2,CONCAT43(_Var3,in_stack_ffffffffffffffc8)),
                    (SourceLocation *)this_00);
  WildcardImportSymbol::setPackage
            ((WildcardImportSymbol *)in_stack_ffffffffffffffd0,
             (PackageSymbol *)CONCAT17(uVar2,CONCAT43(_Var3,in_stack_ffffffffffffffc8)));
  Scope::addWildcardImport((Scope *)this_00,item);
  return;
}

Assistant:

CompilationUnitSymbol::CompilationUnitSymbol(Compilation& compilation,
                                             const SourceLibrary& sourceLibrary) :
    Symbol(SymbolKind::CompilationUnit, "", SourceLocation()), Scope(compilation, this),
    sourceLibrary(sourceLibrary) {

    // Default the time scale to the compilation default. If it turns out
    // this scope has a time unit declaration it will overwrite the member.
    timeScale = compilation.getDefaultTimeScale();

    // All compilation units import the std package automatically.
    auto& stdPkg = compilation.getStdPackage();
    auto import = compilation.emplace<WildcardImportSymbol>(stdPkg.name,
                                                            SourceLocation::NoLocation);
    import->setPackage(stdPkg);
    addWildcardImport(*import);
}